

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

void __thiscall
Memory::PageSegmentBase<Memory::VirtualAllocWrapper>::DecommitFreePagesInternal
          (PageSegmentBase<Memory::VirtualAllocWrapper> *this,uint index,uint pageCount)

{
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *this_00;
  VirtualAllocWrapper *this_01;
  char *currentAddress;
  uint pageCount_local;
  uint index_local;
  PageSegmentBase<Memory::VirtualAllocWrapper> *this_local;
  
  if (pageCount != 0) {
    uVar4 = GetAvailablePageCount(this);
    if (index + pageCount <= uVar4) goto LAB_00982146;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                     ,0x242,
                     "(pageCount > 0 && (index + pageCount) <= this->GetAvailablePageCount())",
                     "pageCount > 0 && (index + pageCount) <= this->GetAvailablePageCount()");
  if (!bVar3) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 0;
LAB_00982146:
  ClearRangeInFreePagesBitVector(this,index,pageCount);
  SetRangeInDecommitPagesBitVector(this,index,pageCount);
  pcVar1 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).address;
  this_00 = SegmentBase<Memory::VirtualAllocWrapper>::GetAllocator
                      (&this->super_SegmentBase<Memory::VirtualAllocWrapper>);
  this_01 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
            ::GetVirtualAllocator(this_00);
  VirtualAllocWrapper::Free(this_01,pcVar1 + (index << 0xc),(ulong)(pageCount << 0xc),0x4000);
  return;
}

Assistant:

void
PageSegmentBase<T>::DecommitFreePagesInternal(uint index, uint pageCount)
{
    Assert(pageCount > 0 && (index + pageCount) <= this->GetAvailablePageCount());
    this->ClearRangeInFreePagesBitVector(index, pageCount);
    this->SetRangeInDecommitPagesBitVector(index, pageCount);

    char * currentAddress = this->address + (index * AutoSystemInfo::PageSize);
#pragma warning(suppress: 6250)
    this->GetAllocator()->GetVirtualAllocator()->Free(currentAddress,
      pageCount * AutoSystemInfo::PageSize, MEM_DECOMMIT);
}